

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * mi_arena_try_alloc_at_id
                 (mi_arena_id_t arena_id,_Bool match_numa_node,int numa_node,size_t size,
                 size_t alignment,_Bool commit,_Bool allow_large,mi_arena_id_t req_arena_id,
                 mi_memid_t *memid)

{
  int iVar1;
  mi_arena_t *arena;
  void *pvVar2;
  ulong uVar3;
  undefined3 in_stack_00000009;
  
  uVar3 = 0x84;
  if (0 < arena_id) {
    uVar3 = (ulong)(arena_id - 1);
  }
  arena = mi_arenas[uVar3];
  if (arena == (mi_arena_t *)0x0) {
    return (void *)0x0;
  }
  if ((!commit) && (arena->is_large != false)) {
    return (void *)0x0;
  }
  if ((arena->id != _allow_large) && ((_allow_large == 0 & (arena->exclusive ^ 1U)) == 0)) {
    return (void *)0x0;
  }
  if (_allow_large == 0) {
    if (numa_node < 0) {
      if (!match_numa_node) {
        return (void *)0x0;
      }
    }
    else {
      iVar1 = arena->numa_node;
      if (match_numa_node) {
        if (iVar1 != numa_node && -1 < iVar1) {
          return (void *)0x0;
        }
      }
      else if (iVar1 == numa_node || -1 >= iVar1) {
        return (void *)0x0;
      }
    }
  }
  pvVar2 = mi_arena_try_alloc_at
                     (arena,size + 0x1ffffff >> 0x19,alignment & 0xff,SUB41(req_arena_id,0),
                      (mi_memid_t *)alignment);
  return pvVar2;
}

Assistant:

static void* mi_arena_try_alloc_at_id(mi_arena_id_t arena_id, bool match_numa_node, int numa_node, size_t size, size_t alignment,
                                       bool commit, bool allow_large, mi_arena_id_t req_arena_id, mi_memid_t* memid )
{
  MI_UNUSED_RELEASE(alignment);
  mi_assert(alignment <= MI_SEGMENT_ALIGN);
  const size_t bcount = mi_block_count_of_size(size);
  const size_t arena_index = mi_arena_id_index(arena_id);
  mi_assert_internal(arena_index < mi_atomic_load_relaxed(&mi_arena_count));
  mi_assert_internal(size <= mi_arena_block_size(bcount));

  // Check arena suitability
  mi_arena_t* arena = mi_arena_from_index(arena_index);
  if (arena == NULL) return NULL;
  if (!allow_large && arena->is_large) return NULL;
  if (!mi_arena_id_is_suitable(arena->id, arena->exclusive, req_arena_id)) return NULL;
  if (req_arena_id == _mi_arena_id_none()) { // in not specific, check numa affinity
    const bool numa_suitable = (numa_node < 0 || arena->numa_node < 0 || arena->numa_node == numa_node);
    if (match_numa_node) { if (!numa_suitable) return NULL; }
                    else { if (numa_suitable) return NULL; }
  }

  // try to allocate
  void* p = mi_arena_try_alloc_at(arena, arena_index, bcount, commit, memid);
  mi_assert_internal(p == NULL || _mi_is_aligned(p, alignment));
  return p;
}